

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type kVar2;
  key_type kVar3;
  key_type kVar4;
  key_type kVar5;
  key_type kVar6;
  AssertionResult *assertion_result;
  value_type actual_predicate_value;
  size_type sVar7;
  reference ppVar8;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  AssertionResult *this_01;
  long in_RDI;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  TypeParam ht_in;
  AssertionResult gtest_ar_;
  stringstream string_buffer;
  int i;
  TypeParam ht_out;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8a8;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b8;
  int in_stack_fffffffffffff8bc;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8c0;
  undefined4 in_stack_fffffffffffff8c8;
  int in_stack_fffffffffffff8cc;
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff8d0;
  undefined8 in_stack_fffffffffffff8d8;
  Type TVar9;
  undefined4 in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e4;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  char *in_stack_fffffffffffff918;
  char *in_stack_fffffffffffff920;
  AssertionResult *in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff934;
  value_type in_stack_fffffffffffff950;
  string local_678 [48];
  key_type local_648;
  undefined1 local_641;
  AssertionResult local_640;
  string local_630 [24];
  value_type *in_stack_fffffffffffff9e8;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9f0;
  AssertionResult local_5f8 [2];
  key_type local_5d4;
  value_type local_580;
  AssertionResult local_578;
  string local_568 [48];
  key_type local_538;
  undefined1 local_531;
  AssertionResult local_530 [2];
  key_type local_50c;
  value_type local_4b8;
  AssertionResult local_4b0 [2];
  key_type local_48c;
  value_type local_438;
  AssertionResult local_430;
  string local_420 [55];
  undefined1 local_3e9;
  AssertionResult local_3e8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_3d8;
  Hasher local_3c8;
  Hasher local_3bc;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_3b0;
  string local_318 [55];
  undefined1 local_2e1;
  AssertionResult local_2e0;
  stringstream local_2d0 [392];
  key_type local_148;
  key_type local_144;
  value_type local_e4;
  int local_dc;
  key_type local_d8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_c8;
  Hasher local_b8;
  Hasher local_ac;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_a0;
  
  bVar1 = google::
          HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    Hasher::Hasher(&local_ac,0);
    Hasher::Hasher(&local_b8,0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_c8,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashMap
              (in_stack_fffffffffffff8d0,
               CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
               (hasher *)in_stack_fffffffffffff8c0,
               (key_equal *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (allocator_type *)in_stack_fffffffffffff8b0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_c8);
    local_d8 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key(in_stack_fffffffffffff8b0,(key_type *)in_stack_fffffffffffff8a8);
    for (local_dc = 1; TVar9 = (Type)((ulong)in_stack_fffffffffffff8d8 >> 0x20), local_dc < 100;
        local_dc = local_dc + 1) {
      in_stack_fffffffffffff950 =
           HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff8a8,0);
      local_e4 = in_stack_fffffffffffff950;
      google::
      BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    }
    kVar2 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
    local_144 = kVar2;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffff8b0,(key_type *)in_stack_fffffffffffff8a8);
    kVar3 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
    local_148 = kVar3;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffff8b0,(key_type *)in_stack_fffffffffffff8a8);
    std::__cxx11::stringstream::stringstream(local_2d0);
    local_2e1 = google::
                BaseHashtableInterface<google::sparse_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
                ::
                serialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,std::__cxx11::stringstream>
                          (&local_a0,local_2d0);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff8b0,(bool *)in_stack_fffffffffffff8a8,
               (type *)0xf8b47d);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                 (char *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),TVar9
                 ,(char *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc,
                 (char *)in_stack_fffffffffffff8c0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                 (Message *)in_stack_fffffffffffff928);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
      std::__cxx11::string::~string(local_318);
      testing::Message::~Message((Message *)0xf8b559);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf8b5f0);
    Hasher::Hasher(&local_3bc,0);
    Hasher::Hasher(&local_3c8,0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_3d8,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashMap
              (in_stack_fffffffffffff8d0,
               CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
               (hasher *)in_stack_fffffffffffff8c0,
               (key_equal *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (allocator_type *)in_stack_fffffffffffff8b0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_3d8);
    local_3e9 = google::
                BaseHashtableInterface<google::sparse_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
                ::
                unserialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,std::__cxx11::stringstream>
                          (&local_3b0,local_2d0);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff8b0,(bool *)in_stack_fffffffffffff8a8,
               (type *)0xf8b6a4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e8);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                 (char *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),TVar9
                 ,(char *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc,
                 (char *)in_stack_fffffffffffff8c0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                 (Message *)in_stack_fffffffffffff928);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
      std::__cxx11::string::~string(local_420);
      testing::Message::~Message((Message *)0xf8b7b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf8b84f);
    local_438 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff8a8,0);
    kVar4 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
    local_48c = kVar4;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffff950,(key_type *)CONCAT44(kVar2,kVar3));
    assertion_result =
         (AssertionResult *)
         google::
         sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)0xf8b8d0);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
               (char *)in_stack_fffffffffffff8c0,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8)
               ,(pair<const_int,_int> *)in_stack_fffffffffffff8b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_430);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      in_stack_fffffffffffff920 =
           testing::AssertionResult::failure_message((AssertionResult *)0xf8b94d);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),TVar9
                 ,(char *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc,
                 (char *)in_stack_fffffffffffff8c0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(kVar4,in_stack_fffffffffffff930),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
      testing::Message::~Message((Message *)0xf8b9aa);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf8ba1b);
    actual_predicate_value =
         HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffff8a8,0);
    local_4b8 = actual_predicate_value;
    kVar5 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
    local_50c = kVar5;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffff950,(key_type *)CONCAT44(kVar2,kVar3));
    google::
    sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf8ba90);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
               (char *)in_stack_fffffffffffff8c0,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8)
               ,(pair<const_int,_int> *)in_stack_fffffffffffff8b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b0);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      testing::AssertionResult::failure_message((AssertionResult *)0xf8bb07);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),TVar9
                 ,(char *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc,
                 (char *)in_stack_fffffffffffff8c0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(kVar4,in_stack_fffffffffffff930),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
      testing::Message::~Message((Message *)0xf8bb64);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf8bbd5);
    local_538 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
    sVar7 = google::
            BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::count(in_stack_fffffffffffff8b0,(key_type *)in_stack_fffffffffffff8a8);
    local_531 = sVar7 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff8b0,(bool *)in_stack_fffffffffffff8a8,
               (type *)0xf8bc3d);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_530);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,in_stack_fffffffffffff920,(char *)actual_predicate_value,
                 (char *)CONCAT44(kVar5,in_stack_fffffffffffff910));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),TVar9
                 ,(char *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc,
                 (char *)in_stack_fffffffffffff8c0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(kVar4,in_stack_fffffffffffff930),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
      std::__cxx11::string::~string(local_568);
      testing::Message::~Message((Message *)0xf8bd12);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf8bda9);
    local_580 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff8a8,0);
    kVar6 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
    local_5d4 = kVar6;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffff950,(key_type *)CONCAT44(kVar2,kVar3));
    ppVar8 = google::
             sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                          *)0xf8be1e);
    TVar9 = (Type)((ulong)ppVar8 >> 0x20);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
               (char *)in_stack_fffffffffffff8c0,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8)
               ,(pair<const_int,_int> *)in_stack_fffffffffffff8b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_578);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(kVar6,in_stack_fffffffffffff8e0));
      in_stack_fffffffffffff8d0 =
           (HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xf8be95);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(kVar6,in_stack_fffffffffffff8e0),TVar9,
                 (char *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc,
                 (char *)in_stack_fffffffffffff8c0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(kVar4,in_stack_fffffffffffff930),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
      testing::Message::~Message((Message *)0xf8bef2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf8bf63);
    kVar2 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
    this_00 = (HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)google::
                 BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::count(in_stack_fffffffffffff8b0,(key_type *)in_stack_fffffffffffff8a8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff8b0,(bool *)in_stack_fffffffffffff8a8,
               (type *)0xf8bfcb);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5f8);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(kVar6,in_stack_fffffffffffff8e0));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,in_stack_fffffffffffff920,(char *)actual_predicate_value,
                 (char *)CONCAT44(kVar5,in_stack_fffffffffffff910));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(kVar6,in_stack_fffffffffffff8e0),TVar9,
                 (char *)in_stack_fffffffffffff8d0,kVar2,(char *)this_00);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(kVar4,in_stack_fffffffffffff930),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
      std::__cxx11::string::~string(local_630);
      testing::Message::~Message((Message *)0xf8c0a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf8c137);
    local_648 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(this_00,in_stack_fffffffffffff8bc);
    this_01 = (AssertionResult *)
              google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff8b0,(key_type *)in_stack_fffffffffffff8a8);
    local_641 = this_01 == (AssertionResult *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (this_01,(bool *)in_stack_fffffffffffff8a8,(type *)0xf8c19f);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_640);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(kVar6,in_stack_fffffffffffff8e0));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,in_stack_fffffffffffff920,(char *)actual_predicate_value,
                 (char *)CONCAT44(kVar5,in_stack_fffffffffffff910));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(kVar6,in_stack_fffffffffffff8e0),TVar9,
                 (char *)in_stack_fffffffffffff8d0,kVar2,(char *)this_00);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(kVar4,in_stack_fffffffffffff930),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
      std::__cxx11::string::~string(local_678);
      testing::Message::~Message((Message *)0xf8c274);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf8c308);
    google::
    HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashMap
              ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf8c315);
    std::__cxx11::stringstream::~stringstream(local_2d0);
    google::
    HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashMap
              ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf8c32f);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToStringStream) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  std::stringstream string_buffer;
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(),
                               &string_buffer));

  TypeParam ht_in;
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(),
                                &string_buffer));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}